

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void help(void)

{
  fwrite("-M [filename] output Moment Event Loss Table (MELT)\n-m [filename] output MELT in parquet format\n-Q [filename] output Quantile Event Loss Table (QELT)\n-q [filename] output QELT in parquet format\n-v version\n-s skip header\n-h help\n"
         ,0xe4,1,_stderr);
  return;
}

Assistant:

void help()
{
	fprintf(stderr,
		"-M [filename] output Moment Event Loss Table (MELT)\n"
		"-m [filename] output MELT in parquet format\n"
		"-Q [filename] output Quantile Event Loss Table (QELT)\n"
		"-q [filename] output QELT in parquet format\n"
		"-v version\n"
		"-s skip header\n"
		"-h help\n"
	);
}